

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::Swap
          (GeneratedMessageReflection *this,Message *message1,Message *message2)

{
  char cVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  LogMessage *pLVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar9;
  Descriptor *pDVar10;
  long *plVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 *puVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  LogFinisher local_e1;
  Message *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (message1 != message2) {
    iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x12])(message1);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar6) != this) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x13b);
      pLVar8 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar8 = LogMessage::operator<<(pLVar8,"First argument to Swap() (of type \"");
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_00,iVar6) + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar8);
      LogMessage::~LogMessage(&local_68);
    }
    iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x12])(message2);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_01,iVar6) != this) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x142);
      pLVar8 = LogMessage::operator<<
                         (&local_a0,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar8 = LogMessage::operator<<(pLVar8,"Second argument to Swap() (of type \"");
      iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_02,iVar6) + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar8);
      LogMessage::~LogMessage(&local_a0);
    }
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      lVar9 = (long)this->has_bits_offset_;
      uVar18 = *(int *)(this->descriptor_ + 0x2c) + 0x1fU >> 5;
      uVar17 = 1;
      if (1 < uVar18) {
        uVar17 = (ulong)uVar18;
      }
      uVar19 = 0;
      do {
        uVar3 = *(undefined4 *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar19 * 4 + lVar9);
        *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar19 * 4 + lVar9)
             = *(undefined4 *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar19 * 4 + lVar9);
        *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar19 * 4 + lVar9)
             = uVar3;
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
    pDVar10 = this->descriptor_;
    if (0 < *(int *)(pDVar10 + 0x2c)) {
      lVar9 = 0;
      lVar20 = 0;
      local_e0 = message2;
      do {
        lVar15 = *(long *)(pDVar10 + 0x30);
        if (*(int *)(lVar15 + 0x30 + lVar9) == 3) {
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar15 + 0x2c + lVar9) * 4)
                ) {
          case 1:
          case 2:
          case 3:
          case 4:
          case 5:
          case 6:
          case 7:
          case 8:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            puVar12 = (undefined8 *)
                      ((long)&(message1->super_MessageLite)._vptr_MessageLite +
                      (long)this->offsets_
                            [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111]);
            puVar14 = (undefined8 *)
                      ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                      (long)this->offsets_
                            [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111]);
            if (puVar12 != puVar14) {
              uVar4 = *puVar12;
              uVar5 = puVar12[1];
              *puVar12 = *puVar14;
              *(undefined4 *)(puVar12 + 1) = *(undefined4 *)(puVar14 + 1);
              *(undefined4 *)((long)puVar12 + 0xc) = *(undefined4 *)((long)puVar14 + 0xc);
              *puVar14 = uVar4;
              puVar14[1] = uVar5;
            }
            break;
          case 9:
          case 10:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            RepeatedPtrFieldBase::Swap
                      ((RepeatedPtrFieldBase *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111]),
                       (RepeatedPtrFieldBase *)
                       ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111]));
            break;
          default:
            LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                       ,0x16d);
            pLVar8 = LogMessage::operator<<(&local_d8,"Unimplemented type: ");
            pLVar8 = LogMessage::operator<<
                               (pLVar8,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(lVar15 + 0x2c + lVar9) * 4));
            LogFinisher::operator=(&local_e1,pLVar8);
LAB_0020c574:
            message2 = local_e0;
            LogMessage::~LogMessage(&local_d8);
          }
        }
        else {
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar15 + 0x2c + lVar9) * 4)
                ) {
          case 1:
          case 3:
          case 8:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            lVar13 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111];
            lVar15 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111];
            uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13)
            ;
            *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13) =
                 *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15);
            *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15) = uVar3
            ;
            break;
          case 2:
          case 4:
          case 9:
          case 10:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            lVar13 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111];
            lVar15 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111];
            uVar4 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13)
            ;
            *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13) =
                 *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15);
            *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15) = uVar4
            ;
            break;
          case 5:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            lVar13 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111];
            lVar15 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111];
            uVar4 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13)
            ;
            *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13) =
                 *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15);
            *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15) = uVar4
            ;
            break;
          case 6:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            lVar13 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111];
            lVar15 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111];
            uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13)
            ;
            *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13) =
                 *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15);
            *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15) = uVar3
            ;
            break;
          case 7:
            cVar1 = *(char *)(lVar15 + 0x34 + lVar9);
            if (cVar1 == '\0') {
              plVar11 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar11 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar11 = (long *)(lVar13 + 0x70);
              }
            }
            if (cVar1 == '\0') {
              plVar16 = (long *)(*(long *)(lVar15 + 0x38 + lVar9) + 0x30);
            }
            else {
              lVar13 = *(long *)(lVar15 + 0x40 + lVar9);
              if (lVar13 == 0) {
                plVar16 = (long *)(*(long *)(lVar15 + 0x20 + lVar9) + 0x80);
              }
              else {
                plVar16 = (long *)(lVar13 + 0x70);
              }
            }
            lVar13 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar11) + lVar9) >> 3) * -0x11111111];
            lVar15 = (long)this->offsets_
                           [(int)((ulong)((lVar15 - *plVar16) + lVar9) >> 3) * -0x11111111];
            uVar2 = *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13)
            ;
            *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar13) =
                 *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15);
            *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar15) = uVar2
            ;
            break;
          default:
            LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                       ,400);
            pLVar8 = LogMessage::operator<<(&local_d8,"Unimplemented type: ");
            pLVar8 = LogMessage::operator<<
                               (pLVar8,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(lVar15 + 0x2c + lVar9) * 4));
            LogFinisher::operator=(&local_e1,pLVar8);
            goto LAB_0020c574;
          }
        }
        lVar20 = lVar20 + 1;
        pDVar10 = this->descriptor_;
        lVar9 = lVar9 + 0x78;
      } while (lVar20 < *(int *)(pDVar10 + 0x2c));
    }
    if (this->extensions_offset_ != -1) {
      iVar6 = this->extensions_offset_;
      if ((long)iVar6 == -1) {
        LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                   ,0x4b5);
        pLVar8 = LogMessage::operator<<(&local_d8,"CHECK failed: (extensions_offset_) != (-1): ");
        LogFinisher::operator=(&local_e1,pLVar8);
        LogMessage::~LogMessage(&local_d8);
      }
      ExtensionSet::Swap((ExtensionSet *)
                         ((long)&(message1->super_MessageLite)._vptr_MessageLite + (long)iVar6),
                         (ExtensionSet *)
                         ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                         (long)this->extensions_offset_));
    }
    iVar6 = (*(this->super_Reflection)._vptr_Reflection[3])(this,message1);
    iVar7 = (*(this->super_Reflection)._vptr_Reflection[3])(this,message2);
    uVar4 = *(undefined8 *)CONCAT44(extraout_var_03,iVar6);
    *(undefined8 *)CONCAT44(extraout_var_03,iVar6) = *(undefined8 *)CONCAT44(extraout_var_04,iVar7);
    *(undefined8 *)CONCAT44(extraout_var_04,iVar7) = uVar4;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::Swap(
    Message* message1,
    Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to Swap() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to Swap() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  uint32* has_bits1 = MutableHasBits(message1);
  uint32* has_bits2 = MutableHasBits(message2);
  int has_bits_size = (descriptor_->field_count() + 31) / 32;

  for (int i = 0; i < has_bits_size; i++) {
    std::swap(has_bits1[i], has_bits2[i]);
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          MutableRaw<RepeatedField<TYPE> >(message1, field)->Swap(           \
              MutableRaw<RepeatedField<TYPE> >(message2, field));            \
          break;

          SWAP_ARRAYS(INT32 , int32 );
          SWAP_ARRAYS(INT64 , int64 );
          SWAP_ARRAYS(UINT32, uint32);
          SWAP_ARRAYS(UINT64, uint64);
          SWAP_ARRAYS(FLOAT , float );
          SWAP_ARRAYS(DOUBLE, double);
          SWAP_ARRAYS(BOOL  , bool  );
          SWAP_ARRAYS(ENUM  , int   );
#undef SWAP_ARRAYS

        case FieldDescriptor::CPPTYPE_STRING:
        case FieldDescriptor::CPPTYPE_MESSAGE:
          MutableRaw<RepeatedPtrFieldBase>(message1, field)->Swap(
              MutableRaw<RepeatedPtrFieldBase>(message2, field));
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    } else {
      switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          std::swap(*MutableRaw<TYPE>(message1, field),                      \
                    *MutableRaw<TYPE>(message2, field));                     \
          break;

          SWAP_VALUES(INT32 , int32 );
          SWAP_VALUES(INT64 , int64 );
          SWAP_VALUES(UINT32, uint32);
          SWAP_VALUES(UINT64, uint64);
          SWAP_VALUES(FLOAT , float );
          SWAP_VALUES(DOUBLE, double);
          SWAP_VALUES(BOOL  , bool  );
          SWAP_VALUES(ENUM  , int   );
#undef SWAP_VALUES
        case FieldDescriptor::CPPTYPE_MESSAGE:
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
          break;

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              std::swap(*MutableRaw<string*>(message1, field),
                        *MutableRaw<string*>(message2, field));
              break;
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    }
  }

  if (extensions_offset_ != -1) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}